

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdb.c
# Opt level: O0

void sysbvm_gdb_unregisterObjectFile(sysbvm_gdb_jit_code_entry_t *entry)

{
  sysbvm_gdb_jit_code_entry_t *entry_local;
  
  if (entry->prev_entry == (sysbvm_gdb_jit_code_entry_s *)0x0) {
    __jit_debug_descriptor.first_entry = entry->next_entry;
  }
  else {
    entry->prev_entry->next_entry = entry->next_entry;
  }
  if (entry->next_entry != (sysbvm_gdb_jit_code_entry_s *)0x0) {
    entry->next_entry->prev_entry = entry->prev_entry;
  }
  entry->next_entry = (sysbvm_gdb_jit_code_entry_s *)0x0;
  entry->prev_entry = (sysbvm_gdb_jit_code_entry_s *)0x0;
  __jit_debug_descriptor.action_flag = 2;
  __jit_debug_descriptor.relevant_entry = entry;
  __jit_debug_register_code();
  return;
}

Assistant:

SYSBVM_API void sysbvm_gdb_unregisterObjectFile(sysbvm_gdb_jit_code_entry_t *entry)
{
    if(entry->prev_entry)
        entry->prev_entry->next_entry = entry->next_entry;
    else
        __jit_debug_descriptor.first_entry = entry->next_entry;

    if(entry->next_entry)
        entry->next_entry->prev_entry = entry->prev_entry;

    entry->prev_entry = entry->next_entry = NULL;
    
    __jit_debug_descriptor.relevant_entry = entry;
    __jit_debug_descriptor.action_flag = SYSBVM_GDB_JIT_UNREGISTER_FN;
    __jit_debug_register_code();
}